

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

float common_embd_similarity_cos(float *embd1,float *embd2,int n)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  int i;
  double sum2;
  double sum1;
  double sum;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  float local_4;
  
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
    local_28 = (double)(*(float *)(in_RDI + (long)local_3c * 4) *
                       *(float *)(in_RSI + (long)local_3c * 4)) + local_28;
    local_30 = (double)(*(float *)(in_RDI + (long)local_3c * 4) *
                       *(float *)(in_RDI + (long)local_3c * 4)) + local_30;
    local_38 = (double)(*(float *)(in_RSI + (long)local_3c * 4) *
                       *(float *)(in_RSI + (long)local_3c * 4)) + local_38;
  }
  if (((local_30 == 0.0) && (!NAN(local_30))) || ((local_38 == 0.0 && (!NAN(local_38))))) {
    if ((((local_30 != 0.0) || (NAN(local_30))) || (local_38 != 0.0)) || (NAN(local_38))) {
      local_4 = 0.0;
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    dVar1 = sqrt(local_30);
    dVar2 = sqrt(local_38);
    local_4 = (float)(local_28 / (dVar1 * dVar2));
  }
  return local_4;
}

Assistant:

float common_embd_similarity_cos(const float * embd1, const float * embd2, int n){
    double sum  = 0.0;
    double sum1 = 0.0;
    double sum2 = 0.0;

    for (int i = 0; i < n; i++) {
        sum  += embd1[i] * embd2[i];
        sum1 += embd1[i] * embd1[i];
        sum2 += embd2[i] * embd2[i];
    }

    // Handle the case where one or both vectors are zero vectors
    if (sum1 == 0.0 || sum2 == 0.0) {
        if (sum1 == 0.0 && sum2 == 0.0) {
            return 1.0f; // two zero vectors are similar
        }
        return 0.0f;
    }

    return sum / (sqrt(sum1) * sqrt(sum2));
}